

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryIOWrapper.h
# Opt level: O0

string * __thiscall Assimp::MemoryIOSystem::CurrentDirectory_abi_cxx11_(MemoryIOSystem *this)

{
  int iVar1;
  undefined4 extraout_var;
  string *local_20;
  MemoryIOSystem *this_local;
  
  if (CurrentDirectory[abi:cxx11]()::empty_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&CurrentDirectory[abi:cxx11]()::empty_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&CurrentDirectory[abi:cxx11]()::empty_abi_cxx11_);
      __cxa_atexit(std::__cxx11::string::~string,&CurrentDirectory[abi:cxx11]()::empty_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&CurrentDirectory[abi:cxx11]()::empty_abi_cxx11_);
    }
  }
  if (this->existing_io == (IOSystem *)0x0) {
    local_20 = &CurrentDirectory[abi:cxx11]()::empty_abi_cxx11_;
  }
  else {
    iVar1 = (*this->existing_io->_vptr_IOSystem[8])();
    local_20 = (string *)CONCAT44(extraout_var,iVar1);
  }
  return local_20;
}

Assistant:

const std::string &CurrentDirectory() const override {
        static std::string empty;
        return existing_io ? existing_io->CurrentDirectory() : empty;
    }